

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Component.cpp
# Opt level: O3

void ExtractPublicDependencies
               (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>_>
                *components)

{
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  Component *comp;
  _Hash_node_base *local_40;
  _Hashtable<Component*,Component*,std::allocator<Component*>,std::__detail::_Identity,std::equal_to<Component*>,std::hash<Component*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  *local_38;
  
  p_Var3 = (components->_M_h)._M_before_begin._M_nxt;
  if (p_Var3 != (_Hash_node_base *)0x0) {
    do {
      local_40 = p_Var3[5]._M_nxt;
      for (p_Var1 = local_40[0x33]._M_nxt; p_Var1 != (_Hash_node_base *)0x0; p_Var1 = p_Var1->_M_nxt
          ) {
        if (*(char *)&p_Var1[1]._M_nxt[0x1b]._M_nxt == '\x01') {
          for (p_Var2 = p_Var1[1]._M_nxt[0xc]._M_nxt; p_Var2 != (_Hash_node_base *)0x0;
              p_Var2 = p_Var2->_M_nxt) {
            std::
            _Hashtable<Component_*,_Component_*,_std::allocator<Component_*>,_std::__detail::_Identity,_std::equal_to<Component_*>,_std::hash<Component_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::_M_erase((_Hashtable<Component_*,_Component_*,_std::allocator<Component_*>,_std::__detail::_Identity,_std::equal_to<Component_*>,_std::hash<Component_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)(local_40 + 0xf),p_Var2[1]._M_nxt + 0x18);
            local_38 = (_Hashtable<Component*,Component*,std::allocator<Component*>,std::__detail::_Identity,std::equal_to<Component*>,std::hash<Component*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)(local_40 + 8);
            std::
            _Hashtable<Component*,Component*,std::allocator<Component*>,std::__detail::_Identity,std::equal_to<Component*>,std::hash<Component*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<Component*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<Component*,false>>>>
                      (local_38,p_Var2[1]._M_nxt + 0x18,&local_38);
          }
        }
      }
      std::
      _Hashtable<Component_*,_Component_*,_std::allocator<Component_*>,_std::__detail::_Identity,_std::equal_to<Component_*>,_std::hash<Component_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_erase((_Hashtable<Component_*,_Component_*,_std::allocator<Component_*>,_std::__detail::_Identity,_std::equal_to<Component_*>,_std::hash<Component_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)(local_40 + 8),&local_40);
      std::
      _Hashtable<Component_*,_Component_*,_std::allocator<Component_*>,_std::__detail::_Identity,_std::equal_to<Component_*>,_std::hash<Component_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_erase((_Hashtable<Component_*,_Component_*,_std::allocator<Component_*>,_std::__detail::_Identity,_std::equal_to<Component_*>,_std::hash<Component_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)(local_40 + 0xf),&local_40);
      p_Var3 = p_Var3->_M_nxt;
    } while (p_Var3 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void ExtractPublicDependencies(std::unordered_map<std::string, Component *> &components) {
    for (auto &c : components) {
        Component *comp = c.second;
        for (auto &fp : comp->files) {
            if (fp->hasExternalInclude) {
                for (auto &dep : fp->dependencies) {
                    comp->privDeps.erase(dep->component);
                    comp->pubDeps.insert(dep->component);
                }
            }
        }
        comp->pubDeps.erase(comp);
        comp->privDeps.erase(comp);
    }
}